

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImGuiViewportP *viewport_00;
  ImGuiWindow *window_00;
  ImDrawData *pIVar1;
  ImGuiContext_conflict *ctx;
  bool bVar2;
  ImGuiViewportP **ppIVar3;
  ImDrawList *pIVar4;
  ImGuiWindow **ppIVar5;
  ImVec2 *lhs;
  ImDrawDataBuilder *out_list;
  ImVec2 *local_108;
  ImGuiWindow *local_100;
  ImGuiWindow *local_f8;
  ImDrawData *draw_data;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImRect local_bc;
  ImRect local_ac;
  float local_9c;
  ImGuiViewportP *pIStack_98;
  float scale;
  ImGuiViewportP *viewport_1;
  int n_3;
  ImVec2 mouse_cursor_uv [4];
  ImVec2 local_5c;
  ImVec2 mouse_cursor_size;
  ImVec2 mouse_cursor_offset;
  int n_2;
  ImGuiWindow *window;
  ImGuiWindow *pIStack_38;
  int n_1;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiViewportP *viewport;
  int n;
  ImGuiContext_conflict *g;
  
  ctx = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1297,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  ctx->FrameCountRendered = ctx->FrameCount;
  (ctx->IO).MetricsRenderWindows = 0;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  for (viewport._4_4_ = 0; viewport._4_4_ != (ctx->Viewports).Size;
      viewport._4_4_ = viewport._4_4_ + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,viewport._4_4_);
    viewport_00 = *ppIVar3;
    ImDrawDataBuilder::Clear(&viewport_00->DrawDataBuilder);
    if (viewport_00->DrawLists[0] != (ImDrawList *)0x0) {
      pIVar4 = GetBackgroundDrawList(&viewport_00->super_ImGuiViewport);
      AddDrawListToDrawData((viewport_00->DrawDataBuilder).Layers,pIVar4);
    }
  }
  if ((ctx->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_f8 = (ImGuiWindow *)0x0;
  }
  else {
    local_f8 = ctx->NavWindowingTarget->RootWindowDockTree;
  }
  pIStack_38 = local_f8;
  if (ctx->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_100 = (ImGuiWindow *)0x0;
  }
  else {
    local_100 = ctx->NavWindowingListWindow;
  }
  windows_to_render_top_most[0] = local_100;
  for (window._4_4_ = 0; window._4_4_ != (ctx->Windows).Size; window._4_4_ = window._4_4_ + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,window._4_4_);
    window_00 = *ppIVar5;
    bVar2 = IsWindowActiveAndVisible(window_00);
    if ((((bVar2) && ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != pIStack_38)) &&
       (window_00 != windows_to_render_top_most[0])) {
      AddRootWindowToDrawData(window_00);
    }
  }
  for (mouse_cursor_offset.x = 0.0; (int)mouse_cursor_offset.x < 2;
      mouse_cursor_offset.x = (float)((int)mouse_cursor_offset.x + 1)) {
    if ((*(long *)((long)&stack0xffffffffffffffc8 + (long)(int)mouse_cursor_offset.x * 8) != 0) &&
       (bVar2 = IsWindowActiveAndVisible
                          (*(ImGuiWindow **)
                            ((long)&stack0xffffffffffffffc8 + (long)(int)mouse_cursor_offset.x * 8))
       , bVar2)) {
      AddRootWindowToDrawData
                (*(ImGuiWindow **)
                  ((long)&stack0xffffffffffffffc8 + (long)(int)mouse_cursor_offset.x * 8));
    }
  }
  ImVec2::ImVec2(&mouse_cursor_size);
  ImVec2::ImVec2(&local_5c);
  local_108 = (ImVec2 *)&stack0xffffffffffffff78;
  do {
    ImVec2::ImVec2(local_108);
    local_108 = local_108 + 1;
  } while (local_108 != mouse_cursor_uv + 3);
  if ((((ctx->IO).MouseDrawCursor & 1U) != 0) && (ctx->MouseCursor != -1)) {
    ImFontAtlas::GetMouseCursorTexData
              ((ctx->IO).Fonts,ctx->MouseCursor,&mouse_cursor_size,&local_5c,
               (ImVec2 *)&stack0xffffffffffffff78,mouse_cursor_uv + 1);
  }
  (ctx->IO).MetricsRenderIndices = 0;
  (ctx->IO).MetricsRenderVertices = 0;
  for (viewport_1._4_4_ = 0; viewport_1._4_4_ < (ctx->Viewports).Size;
      viewport_1._4_4_ = viewport_1._4_4_ + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,viewport_1._4_4_);
    pIStack_98 = *ppIVar3;
    ImDrawDataBuilder::FlattenIntoSingleLayer(&pIStack_98->DrawDataBuilder);
    if ((0.0 < local_5c.x) && (0.0 < local_5c.y)) {
      local_9c = (ctx->Style).MouseCursorScale * (pIStack_98->super_ImGuiViewport).DpiScale;
      local_ac = ImGuiViewportP::GetMainRect(pIStack_98);
      lhs = &(ctx->IO).MousePos;
      ImVec2::ImVec2(&local_d4,local_5c.x + 2.0,local_5c.y + 2.0);
      local_cc = operator*(&local_d4,local_9c);
      local_c4 = operator+(lhs,&local_cc);
      ImRect::ImRect(&local_bc,lhs,&local_c4);
      bVar2 = ImRect::Overlaps(&local_ac,&local_bc);
      if (bVar2) {
        pIVar4 = GetForegroundDrawList(&pIStack_98->super_ImGuiViewport);
        RenderMouseCursor(pIVar4,(ctx->IO).MousePos,local_9c,ctx->MouseCursor,0xffffffff,0xff000000,
                          0x30000000);
      }
    }
    if (pIStack_98->DrawLists[1] != (ImDrawList *)0x0) {
      out_list = &pIStack_98->DrawDataBuilder;
      pIVar4 = GetForegroundDrawList(&pIStack_98->super_ImGuiViewport);
      AddDrawListToDrawData(out_list->Layers,pIVar4);
    }
    SetupViewportDrawData(pIStack_98,(pIStack_98->DrawDataBuilder).Layers);
    pIVar1 = (pIStack_98->super_ImGuiViewport).DrawData;
    (ctx->IO).MetricsRenderVertices = pIVar1->TotalVtxCount + (ctx->IO).MetricsRenderVertices;
    (ctx->IO).MetricsRenderIndices = pIVar1->TotalIdxCount + (ctx->IO).MetricsRenderIndices;
  }
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}